

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::ObjectAppearance::SetPercentageComplete(ObjectAppearance *this,KUINT8 P)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (P < 0x65) {
    (this->m_GeneralAppearanceUnion).m_ui8GeneralAppearance[0] = P;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SetPercentageComplete",&local_39);
  KException::KException<char_const*>(this_00,&local_38,8,"Acceptable values are 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void ObjectAppearance::SetPercentageComplete(KUINT8 P) noexcept(false)
{
    if( P > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "Acceptable values are 0-100." );

    m_GeneralAppearanceUnion.m_ui16PcComp = P;
}